

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::AddCMakePaths(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_COMMAND","");
  psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  cmState::AddCacheEntry
            (this->State,&local_40,(psVar4->_M_dataplus)._M_p,"Path to CMake executable.",INTERNAL);
  UnwatchUnusedCli(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_CTEST_COMMAND","");
  psVar4 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  cmState::AddCacheEntry
            (this->State,&local_40,(psVar4->_M_dataplus)._M_p,"Path to ctest program executable.",
             INTERNAL);
  UnwatchUnusedCli(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_CPACK_COMMAND","");
  psVar4 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  cmState::AddCacheEntry
            (this->State,&local_40,(psVar4->_M_dataplus)._M_p,"Path to cpack program executable.",
             INTERNAL);
  UnwatchUnusedCli(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + psVar4->_M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  bVar3 = cmsys::SystemTools::FileExists(local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_ROOT","");
    psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmState::AddCacheEntry
              (this->State,&local_40,(psVar4->_M_dataplus)._M_p,"Path to CMake installation.",
               INTERNAL);
    UnwatchUnusedCli(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    iVar5 = 1;
  }
  else {
    psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    iVar5 = 0;
    cmSystemTools::Error
              ("Could not find CMAKE_ROOT !!!\nCMake has most likely not been installed correctly.\nModules directory not found in\n"
               ,(psVar4->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
  }
  return iVar5;
}

Assistant:

int cmake::AddCMakePaths()
{
  // Save the value in the cache
  this->AddCacheEntry("CMAKE_COMMAND",
                      cmSystemTools::GetCMakeCommand().c_str(),
                      "Path to CMake executable.", cmStateEnums::INTERNAL);
#ifdef CMAKE_BUILD_WITH_CMAKE
  this->AddCacheEntry(
    "CMAKE_CTEST_COMMAND", cmSystemTools::GetCTestCommand().c_str(),
    "Path to ctest program executable.", cmStateEnums::INTERNAL);
  this->AddCacheEntry(
    "CMAKE_CPACK_COMMAND", cmSystemTools::GetCPackCommand().c_str(),
    "Path to cpack program executable.", cmStateEnums::INTERNAL);
#endif
  if (!cmSystemTools::FileExists(
        (cmSystemTools::GetCMakeRoot() + "/Modules/CMake.cmake").c_str())) {
    // couldn't find modules
    cmSystemTools::Error(
      "Could not find CMAKE_ROOT !!!\n"
      "CMake has most likely not been installed correctly.\n"
      "Modules directory not found in\n",
      cmSystemTools::GetCMakeRoot().c_str());
    return 0;
  }
  this->AddCacheEntry("CMAKE_ROOT", cmSystemTools::GetCMakeRoot().c_str(),
                      "Path to CMake installation.", cmStateEnums::INTERNAL);

  return 1;
}